

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::priceByRow
          (HighsSparseMatrix *this,bool quad_precision,HVector *result,HVector *column,
          HighsInt debug_report)

{
  int in_R8D;
  double switch_density;
  HighsInt from_index;
  double expected_density;
  HighsInt in_stack_0000010c;
  double in_stack_00000110;
  HighsInt in_stack_0000011c;
  double in_stack_00000120;
  HVector *in_stack_00000128;
  HVector *in_stack_00000130;
  bool in_stack_0000013f;
  HighsSparseMatrix *in_stack_00000140;
  
  if (-2 < in_R8D) {
    printf("\nHighsSparseMatrix::priceByRow:\n");
  }
  priceByRowWithSwitch
            (in_stack_00000140,in_stack_0000013f,in_stack_00000130,in_stack_00000128,
             in_stack_00000120,in_stack_0000011c,in_stack_00000110,in_stack_0000010c);
  return;
}

Assistant:

void HighsSparseMatrix::priceByRow(const bool quad_precision, HVector& result,
                                   const HVector& column,
                                   const HighsInt debug_report) const {
  assert(this->isRowwise());
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::priceByRow:\n");
  // Vanilla hyper-sparse row-wise PRICE. Set up parameters so that
  // priceByRowWithSwitch runs as vanilla hyper-sparse PRICE
  // Expected density always forces hyper-sparse PRICE
  const double expected_density = -kHighsInf;
  // Always start from first index of column
  HighsInt from_index = 0;
  // Never switch to standard row-wise PRICE
  const double switch_density = kHighsInf;
  this->priceByRowWithSwitch(quad_precision, result, column, expected_density,
                             from_index, switch_density);
}